

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  size_type __n;
  FILE *__s;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint32_t MAXSIZE;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  uint32_t tsize;
  string ofilename;
  string ifilename;
  CSVFlatFile cvs;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             " This will map a table (stored in a CSV file) to a row  oriented flat file of frequency attributed 32-bit integers "
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             " usage : cvs2maropu mycvsfile.cvs mymaropufile.bin ");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar6 = -1;
  }
  else {
    std::__cxx11::string::string((string *)&ifilename,argv[1],(allocator *)&cvs);
    std::__cxx11::string::string((string *)&ofilename,argv[2],(allocator *)&cvs);
    FastPForLib::CSVFlatFile::CSVFlatFile(&cvs,ifilename._M_dataplus._M_p,0);
    __n = ((long)cvs.mapping.
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)cvs.mapping.
                super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    iVar6 = (int)__n;
    uVar5 = (ulong)(uint)((int)cvs.NumberOfLines * iVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container,__n,(allocator_type *)&MAXSIZE);
    __s = fopen(ofilename._M_dataplus._M_p,"w+b");
    if (__s == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout," could not open ");
      poVar2 = std::operator<<(poVar2,(string *)&ofilename);
      poVar2 = std::operator<<(poVar2," for writing...");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ifstream::close();
    }
    else {
      MAXSIZE = iVar6 << 0x14;
      while (uVar5 == 0) {
        sVar3 = fwrite(&MAXSIZE,4,1,__s);
        if (sVar3 != 1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
          std::endl<char,std::char_traits<char>>(poVar2);
          fclose(__s);
          std::ifstream::close();
          goto LAB_001026b6;
        }
        iVar4 = 0;
        do {
          bVar1 = FastPForLib::CSVFlatFile::
                  nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&cvs,&container);
          if (!bVar1) break;
          sVar3 = fwrite(container.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,__n << 2,1,__s);
          if (sVar3 != 1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
            std::endl<char,std::char_traits<char>>(poVar2);
            fclose(__s);
            std::ifstream::close();
            goto LAB_001026b6;
          }
          iVar4 = iVar4 + iVar6;
        } while (iVar4 != 0);
        uVar5 = -(ulong)MAXSIZE;
      }
      tsize = (uint32_t)uVar5;
      sVar3 = fwrite(&tsize,4,1,__s);
      if (sVar3 == 1) {
        do {
          bVar1 = FastPForLib::CSVFlatFile::
                  nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&cvs,&container);
          if (!bVar1) {
            fclose(__s);
            std::ifstream::close();
            poVar2 = std::operator<<((ostream *)&std::cout,"#file ");
            poVar2 = std::operator<<(poVar2,(string *)&ofilename);
            poVar2 = std::operator<<(poVar2," contains your data.");
            iVar6 = 0;
            std::endl<char,std::char_traits<char>>(poVar2);
            goto LAB_001026b9;
          }
          sVar3 = fwrite(container.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,__n << 2,1,__s);
        } while (sVar3 == 1);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
      std::endl<char,std::char_traits<char>>(poVar2);
      fclose(__s);
      std::ifstream::close();
    }
LAB_001026b6:
    iVar6 = -1;
LAB_001026b9:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&container.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    FastPForLib::CSVFlatFile::~CSVFlatFile(&cvs);
    std::__cxx11::string::~string((string *)&ofilename);
    std::__cxx11::string::~string((string *)&ifilename);
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    cerr << " This will map a table (stored in a CSV file) to a row "
            " oriented flat file of frequency attributed 32-bit integers "
         << endl;
    cerr << " usage : cvs2maropu mycvsfile.cvs mymaropufile.bin " << endl;
    return -1;
  }
  string ifilename(argv[1]);
  string ofilename(argv[2]);
  CSVFlatFile cvs(ifilename.c_str(), CSVFlatFile::FREQNORMALISATION);
  const size_t c = cvs.getNumberOfColumns();
  const size_t N = cvs.getNumberOfRows();
  size_t integers = static_cast<uint32_t>(c * N);
  vector<uint32_t> container(c);
  FILE *fd = ::fopen(ofilename.c_str(), "w+b");
  if (fd == NULL) {
    cout << " could not open " << ofilename << " for writing..." << endl;
    cvs.close();
    return -1;
  }
  uint32_t MAXSIZE = static_cast<uint32_t>(c * (1U << 20));
  for (size_t block = 0; block * MAXSIZE >= integers; integers -= MAXSIZE) {
    if (fwrite(&MAXSIZE, sizeof(MAXSIZE), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    uint32_t counter = 0;
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
      counter += static_cast<uint32_t>(c);
      if (counter == block)
        break;
      assert(counter < block);
    }
  }
  if (integers > 0) {
    uint32_t tsize = static_cast<uint32_t>(integers);
    if (fwrite(&tsize, sizeof(tsize), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
    }
  }
  ::fclose(fd);
  cvs.close();
  cout << "#file " << ofilename << " contains your data." << endl;
}